

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

double __thiscall Function::getValue(Function *this)

{
  code *pcVar1;
  ostream *poVar2;
  double dVar3;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (this->bValueValid == false) {
    this->dLastValue = this->dValue;
    pcVar1 = (code *)this->xFunction;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)(this->super_Physical).physicalUnit.siUnits +
                                            *(long *)&this->field_0xd0 + -0x34) + -1);
    }
    dVar3 = (double)(*pcVar1)();
    this->dValue = dVar3;
    this->bValueValid = true;
  }
  if (this->bVerbose == true) {
    poVar2 = std::ostream::_M_insert<double>(this->dValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," <- ",4);
    (*(this->super_Physical)._vptr_Physical[0xb])(&local_38,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_38,local_30);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return this->dValue;
}

Assistant:

double Function::getValue() const
{
	if (!bValueValid) {
		dLastValue = dValue;
		dValue = (this->*xFunction)();
		bValueValid = true;
	}
	if (bVerbose)
		(*oLog) << dValue << " <- " << getName() << endl;
	return dValue;
}